

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

void __thiscall tcu::DebugOutStreambuf::DebugOutStreambuf(DebugOutStreambuf *this)

{
  *(code **)this = sysconf;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::locale::locale((locale *)&this->field_0x38);
  *(undefined ***)this = &PTR__DebugOutStreambuf_00d4ad60;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_curLine);
  return;
}

Assistant:

DebugOutStreambuf::DebugOutStreambuf (void)
{
}